

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binning.cpp
# Opt level: O2

void duckdb::EquiWidthBinFunction<double,duckdb::EquiWidthBinsDouble>
               (DataChunk *args,ExpressionState *state,Vector *result)

{
  double min;
  pointer input_max;
  sel_t *psVar1;
  sel_t *psVar2;
  sel_t *psVar3;
  sel_t *psVar4;
  ulong bin_count;
  Expression *pEVar5;
  reference this;
  reference this_00;
  reference this_01;
  reference this_02;
  idx_t iVar6;
  reference pvVar7;
  InvalidInputException *pIVar8;
  idx_t iVar9;
  idx_t iVar10;
  idx_t iVar11;
  idx_t count;
  idx_t idx;
  bool bVar12;
  GenericListType<duckdb::PrimitiveType<double>_> result_bins;
  _Vector_base<duckdb::PrimitiveType<double>,_std::allocator<duckdb::PrimitiveType<double>_>_>
  local_200;
  _Vector_base<duckdb::PrimitiveType<double>,_std::allocator<duckdb::PrimitiveType<double>_>_>
  local_1e8;
  LogicalType local_1d0;
  STRUCT_STATE a_state;
  STRUCT_STATE d_state;
  STRUCT_STATE c_state;
  STRUCT_STATE b_state;
  Vector intermediate_result;
  
  this = vector<duckdb::Vector,_true>::get<true>(&args->data,0);
  this_00 = vector<duckdb::Vector,_true>::get<true>(&args->data,1);
  this_01 = vector<duckdb::Vector,_true>::get<true>(&args->data,2);
  this_02 = vector<duckdb::Vector,_true>::get<true>(&args->data,3);
  LogicalType::LogicalType((LogicalType *)&a_state,DOUBLE);
  LogicalType::LIST(&local_1d0,(LogicalType *)&a_state);
  Vector::Vector(&intermediate_result,&local_1d0,0x800);
  LogicalType::~LogicalType(&local_1d0);
  LogicalType::~LogicalType((LogicalType *)&a_state);
  bVar12 = false;
  if (((this->vector_type == CONSTANT_VECTOR) && (this_00->vector_type == CONSTANT_VECTOR)) &&
     (this_01->vector_type == CONSTANT_VECTOR)) {
    bVar12 = this_02->vector_type == CONSTANT_VECTOR;
  }
  count = args->count;
  UnifiedVectorFormat::UnifiedVectorFormat(&a_state.main_data);
  UnifiedVectorFormat::UnifiedVectorFormat(&b_state.main_data);
  UnifiedVectorFormat::UnifiedVectorFormat(&c_state.main_data);
  UnifiedVectorFormat::UnifiedVectorFormat(&d_state.main_data);
  Vector::ToUnifiedFormat(this,count,&a_state.main_data);
  Vector::ToUnifiedFormat(this_00,count,&b_state.main_data);
  Vector::ToUnifiedFormat(this_01,count,&c_state.main_data);
  Vector::ToUnifiedFormat(this_02,count,&d_state.main_data);
  if (bVar12) {
    count = 1;
  }
  idx = 0;
  do {
    if (count == idx) {
      if (bVar12) {
        Vector::SetVectorType(&intermediate_result,CONSTANT_VECTOR);
      }
      UnifiedVectorFormat::~UnifiedVectorFormat(&d_state.main_data);
      UnifiedVectorFormat::~UnifiedVectorFormat(&c_state.main_data);
      UnifiedVectorFormat::~UnifiedVectorFormat(&b_state.main_data);
      UnifiedVectorFormat::~UnifiedVectorFormat(&a_state.main_data);
      VectorOperations::DefaultCast(&intermediate_result,result,args->count,false);
      Vector::~Vector(&intermediate_result);
      return;
    }
    psVar1 = (a_state.main_data.sel)->sel_vector;
    iVar10 = idx;
    if (psVar1 != (sel_t *)0x0) {
      iVar10 = (idx_t)psVar1[idx];
    }
    psVar2 = (b_state.main_data.sel)->sel_vector;
    iVar6 = idx;
    if (psVar2 != (sel_t *)0x0) {
      iVar6 = (idx_t)psVar2[idx];
    }
    psVar3 = (c_state.main_data.sel)->sel_vector;
    iVar9 = idx;
    if (psVar3 != (sel_t *)0x0) {
      iVar9 = (idx_t)psVar3[idx];
    }
    psVar4 = (d_state.main_data.sel)->sel_vector;
    iVar11 = idx;
    if (psVar4 != (sel_t *)0x0) {
      iVar11 = (idx_t)psVar4[idx];
    }
    if (((((a_state.main_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) ||
          ((a_state.main_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
            [iVar10 >> 6] >> (iVar10 & 0x3f) & 1) != 0)) &&
         ((b_state.main_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
           (unsigned_long *)0x0 ||
          ((b_state.main_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
            [iVar6 >> 6] >> (iVar6 & 0x3f) & 1) != 0)))) &&
        ((c_state.main_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
          (unsigned_long *)0x0 ||
         ((c_state.main_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
           [iVar9 >> 6] >> (iVar9 & 0x3f) & 1) != 0)))) &&
       ((d_state.main_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
         (unsigned_long *)0x0 ||
        ((d_state.main_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
          [iVar11 >> 6] >> (iVar11 & 0x3f) & 1) != 0)))) {
      iVar10 = idx;
      if (psVar1 != (sel_t *)0x0) {
        iVar10 = (idx_t)psVar1[idx];
      }
      iVar6 = idx;
      if (psVar2 != (sel_t *)0x0) {
        iVar6 = (idx_t)psVar2[idx];
      }
      iVar9 = idx;
      if (psVar3 != (sel_t *)0x0) {
        iVar9 = (idx_t)psVar3[idx];
      }
      iVar11 = idx;
      if (psVar4 != (sel_t *)0x0) {
        iVar11 = (idx_t)psVar4[idx];
      }
      min = *(double *)(a_state.main_data.data + iVar10 * 8);
      input_max = *(pointer *)(b_state.main_data.data + iVar6 * 8);
      if ((double)input_max < min) {
        pIVar8 = (InvalidInputException *)__cxa_allocate_exception(0x10);
        pEVar5 = state->expr;
        ::std::__cxx11::string::string
                  ((string *)&result_bins,
                   "Invalid input for bin function - max value is smaller than min value",
                   (allocator *)&local_200);
        InvalidInputException::InvalidInputException<>(pIVar8,pEVar5,(string *)&result_bins);
        __cxa_throw(pIVar8,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
      }
      bin_count = *(ulong *)(c_state.main_data.data + iVar9 * 8);
      if ((long)bin_count < 1) {
        pIVar8 = (InvalidInputException *)__cxa_allocate_exception(0x10);
        pEVar5 = state->expr;
        ::std::__cxx11::string::string
                  ((string *)&result_bins,"Invalid input for bin function - there must be > 0 bins",
                   (allocator *)&local_200);
        InvalidInputException::InvalidInputException<>(pIVar8,pEVar5,(string *)&result_bins);
        __cxa_throw(pIVar8,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
      }
      if (1000000 < bin_count) {
        pIVar8 = (InvalidInputException *)__cxa_allocate_exception(0x10);
        pEVar5 = state->expr;
        ::std::__cxx11::string::string
                  ((string *)&result_bins,
                   "Invalid input for bin function - max bin count of %d exceeded",
                   (allocator *)&local_200);
        InvalidInputException::InvalidInputException<long>
                  (pIVar8,pEVar5,(string *)&result_bins,1000000);
        __cxa_throw(pIVar8,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
      }
      result_bins.values.
      super_vector<duckdb::PrimitiveType<double>,_std::allocator<duckdb::PrimitiveType<double>_>_>.
      super__Vector_base<duckdb::PrimitiveType<double>,_std::allocator<duckdb::PrimitiveType<double>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      result_bins.values.
      super_vector<duckdb::PrimitiveType<double>,_std::allocator<duckdb::PrimitiveType<double>_>_>.
      super__Vector_base<duckdb::PrimitiveType<double>,_std::allocator<duckdb::PrimitiveType<double>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      result_bins.values.
      super_vector<duckdb::PrimitiveType<double>,_std::allocator<duckdb::PrimitiveType<double>_>_>.
      super__Vector_base<duckdb::PrimitiveType<double>,_std::allocator<duckdb::PrimitiveType<double>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      if (((double)input_max != min) || (NAN((double)input_max) || NAN(min))) {
        EquiWidthBinsDouble::Operation
                  ((vector<duckdb::PrimitiveType<double>,_true> *)&local_200,state->expr,min,
                   (double)input_max,bin_count,(bool)d_state.main_data.data[iVar11]);
        ::std::
        vector<duckdb::PrimitiveType<double>,_std::allocator<duckdb::PrimitiveType<double>_>_>::
        _M_move_assign((vector<duckdb::PrimitiveType<double>,_std::allocator<duckdb::PrimitiveType<double>_>_>
                        *)&result_bins);
        ::std::
        _Vector_base<duckdb::PrimitiveType<double>,_std::allocator<duckdb::PrimitiveType<double>_>_>
        ::~_Vector_base(&local_200);
        pvVar7 = vector<duckdb::PrimitiveType<double>,_true>::get<true>
                           ((vector<duckdb::PrimitiveType<double>,_true> *)&result_bins,0);
        if (pvVar7->val <= (double)input_max && (double)input_max != pvVar7->val) {
          pvVar7 = vector<duckdb::PrimitiveType<double>,_true>::get<true>
                             ((vector<duckdb::PrimitiveType<double>,_true> *)&result_bins,0);
          pvVar7->val = (double)input_max;
        }
        ::std::
        __reverse<__gnu_cxx::__normal_iterator<duckdb::PrimitiveType<double>*,std::vector<duckdb::PrimitiveType<double>,std::allocator<duckdb::PrimitiveType<double>>>>>
                  (result_bins.values.
                   super_vector<duckdb::PrimitiveType<double>,_std::allocator<duckdb::PrimitiveType<double>_>_>
                   .
                   super__Vector_base<duckdb::PrimitiveType<double>,_std::allocator<duckdb::PrimitiveType<double>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,
                   result_bins.values.
                   super_vector<duckdb::PrimitiveType<double>,_std::allocator<duckdb::PrimitiveType<double>_>_>
                   .
                   super__Vector_base<duckdb::PrimitiveType<double>,_std::allocator<duckdb::PrimitiveType<double>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish);
      }
      else {
        local_200._M_impl.super__Vector_impl_data._M_start = input_max;
        ::std::vector<duckdb::PrimitiveType<double>,std::allocator<duckdb::PrimitiveType<double>>>::
        emplace_back<duckdb::PrimitiveType<double>>
                  ((vector<duckdb::PrimitiveType<double>,std::allocator<duckdb::PrimitiveType<double>>>
                    *)&result_bins,(PrimitiveType<double> *)&local_200);
      }
      local_1e8._M_impl.super__Vector_impl_data._M_start =
           result_bins.values.
           super_vector<duckdb::PrimitiveType<double>,_std::allocator<duckdb::PrimitiveType<double>_>_>
           .
           super__Vector_base<duckdb::PrimitiveType<double>,_std::allocator<duckdb::PrimitiveType<double>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_1e8._M_impl.super__Vector_impl_data._M_finish =
           result_bins.values.
           super_vector<duckdb::PrimitiveType<double>,_std::allocator<duckdb::PrimitiveType<double>_>_>
           .
           super__Vector_base<duckdb::PrimitiveType<double>,_std::allocator<duckdb::PrimitiveType<double>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_1e8._M_impl.super__Vector_impl_data._M_end_of_storage =
           result_bins.values.
           super_vector<duckdb::PrimitiveType<double>,_std::allocator<duckdb::PrimitiveType<double>_>_>
           .
           super__Vector_base<duckdb::PrimitiveType<double>,_std::allocator<duckdb::PrimitiveType<double>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      result_bins.values.
      super_vector<duckdb::PrimitiveType<double>,_std::allocator<duckdb::PrimitiveType<double>_>_>.
      super__Vector_base<duckdb::PrimitiveType<double>,_std::allocator<duckdb::PrimitiveType<double>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      result_bins.values.
      super_vector<duckdb::PrimitiveType<double>,_std::allocator<duckdb::PrimitiveType<double>_>_>.
      super__Vector_base<duckdb::PrimitiveType<double>,_std::allocator<duckdb::PrimitiveType<double>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      result_bins.values.
      super_vector<duckdb::PrimitiveType<double>,_std::allocator<duckdb::PrimitiveType<double>_>_>.
      super__Vector_base<duckdb::PrimitiveType<double>,_std::allocator<duckdb::PrimitiveType<double>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      ::std::
      _Vector_base<duckdb::PrimitiveType<double>,_std::allocator<duckdb::PrimitiveType<double>_>_>::
      ~_Vector_base((_Vector_base<duckdb::PrimitiveType<double>,_std::allocator<duckdb::PrimitiveType<double>_>_>
                     *)&result_bins);
      GenericListType<duckdb::PrimitiveType<double>_>::AssignResult
                (&intermediate_result,idx,
                 (GenericListType<duckdb::PrimitiveType<double>_> *)&local_1e8);
      ::std::
      _Vector_base<duckdb::PrimitiveType<double>,_std::allocator<duckdb::PrimitiveType<double>_>_>::
      ~_Vector_base(&local_1e8);
    }
    else {
      FlatVector::SetNull(&intermediate_result,idx,true);
    }
    idx = idx + 1;
  } while( true );
}

Assistant:

static void EquiWidthBinFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	static constexpr int64_t MAX_BIN_COUNT = 1000000;
	auto &min_arg = args.data[0];
	auto &max_arg = args.data[1];
	auto &bin_count = args.data[2];
	auto &nice_rounding = args.data[3];

	Vector intermediate_result(LogicalType::LIST(OP::LOGICAL_TYPE));
	GenericExecutor::ExecuteQuaternary<PrimitiveType<T>, PrimitiveType<T>, PrimitiveType<int64_t>, PrimitiveType<bool>,
	                                   GenericListType<PrimitiveType<T>>>(
	    min_arg, max_arg, bin_count, nice_rounding, intermediate_result, args.size(),
	    [&](PrimitiveType<T> min_p, PrimitiveType<T> max_p, PrimitiveType<int64_t> bins_p,
	        PrimitiveType<bool> nice_rounding_p) {
		    if (max_p.val < min_p.val) {
			    throw InvalidInputException(state.expr,
			                                "Invalid input for bin function - max value is smaller than min value");
		    }
		    if (bins_p.val <= 0) {
			    throw InvalidInputException(state.expr, "Invalid input for bin function - there must be > 0 bins");
		    }
		    if (bins_p.val > MAX_BIN_COUNT) {
			    throw InvalidInputException(state.expr, "Invalid input for bin function - max bin count of %d exceeded",
			                                MAX_BIN_COUNT);
		    }
		    GenericListType<PrimitiveType<T>> result_bins;
		    if (max_p.val == min_p.val) {
			    // if max = min return a single bucket
			    result_bins.values.push_back(max_p.val);
		    } else {
			    result_bins.values = OP::Operation(state.expr, min_p.val, max_p.val, static_cast<idx_t>(bins_p.val),
			                                       nice_rounding_p.val);
			    // last bin should always be the input max
			    if (result_bins.values[0].val < max_p.val) {
				    result_bins.values[0].val = max_p.val;
			    }
			    std::reverse(result_bins.values.begin(), result_bins.values.end());
		    }
		    return result_bins;
	    });
	VectorOperations::DefaultCast(intermediate_result, result, args.size());
}